

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

int stb_size_varlen64(stb_uint64 v)

{
  int iVar1;
  
  iVar1 = 1;
  if ((((0x7f < v) && (iVar1 = 2, 0x3fff < v)) && (iVar1 = 3, 0x1fffff < v)) &&
     (((iVar1 = 4, 0xfffffff < v && (iVar1 = 5, v >> 0x23 != 0)) &&
      ((iVar1 = 6, v >> 0x2a != 0 && (iVar1 = 7, v >> 0x31 != 0)))))) {
    iVar1 = 9 - (uint)(v >> 0x38 == 0);
  }
  return iVar1;
}

Assistant:

int stb_size_varlen64(stb_uint64 v)
{
   if (v < 0x00000080) return 1;
   if (v < 0x00004000) return 2;
   if (v < 0x00200000) return 3;
   if (v < 0x10000000) return 4;
   if (v < STB_IMM_UINT64(0x0000000800000000)) return 5;
   if (v < STB_IMM_UINT64(0x0000040000000000)) return 6;
   if (v < STB_IMM_UINT64(0x0002000000000000)) return 7;
   if (v < STB_IMM_UINT64(0x0100000000000000)) return 8; 
   return 9;
}